

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::SetLoopBodyStSlot(IRBuilder *this,SymID symID,bool isCatchObjectSym)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  uint functionId;
  BVIndex BVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  StackSym *dstSym;
  bool isCatchObjectSym_local;
  SymID symID_local;
  IRBuilder *this_local;
  
  BVar3 = Func::HasTry(this->m_func);
  if (BVar3 != 0) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,JITLoopBodyInTryCatchPhase,sourceContextId,functionId
                      );
    if (!bVar2) {
      if (isCatchObjectSym) {
        return;
      }
      pSVar5 = StackSym::FindOrCreate(symID,symID,this->m_func,TyVar);
      if (pSVar5 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x10f7,"(dstSym)","dstSym");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((*(uint *)&pSVar5->field_0x18 >> 0x1b & 1) != 0) {
        return;
      }
    }
  }
  BVar4 = BVFixed::Length(this->m_stSlots);
  if (BVar4 <= symID) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x10fd,"(symID < m_stSlots->Length())","symID < m_stSlots->Length()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVFixed::Set(this->m_stSlots,symID);
  return;
}

Assistant:

void
IRBuilder::SetLoopBodyStSlot(SymID symID, bool isCatchObjectSym)
{
    if (this->m_func->HasTry() && !PHASE_OFF(Js::JITLoopBodyInTryCatchPhase, this->m_func))
    {
        // No need to emit StSlot for a catch object. In fact, if we do, we might be storing an uninitialized value to the slot.
        if (isCatchObjectSym)
        {
            return;
        }
        StackSym * dstSym = StackSym::FindOrCreate(symID, (Js::RegSlot)symID, m_func);
        Assert(dstSym);
        if (dstSym->m_isCatchObjectSym)
        {
            return;
        }
    }
    AssertOrFailFast(symID < m_stSlots->Length());
    this->m_stSlots->Set(symID);
}